

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.h
# Opt level: O0

void __thiscall GlobOptBlockData::GlobOptBlockData(GlobOptBlockData *this,Func *func)

{
  Func *func_local;
  GlobOptBlockData *this_local;
  
  this->symToValueMap = (GlobHashTable *)0x0;
  this->exprToValueMap = (ExprHashTable *)0x0;
  this->liveFields = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->liveArrayValues = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->maybeWrittenTypeSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->liveVarSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->liveInt32Syms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->liveLossyInt32Syms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->liveFloat64Syms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->argObjSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->maybeTempObjectSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->canStoreTempObjectSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->curFunc = func;
  this->valuesToKillOnCalls = (ValueSet *)0x0;
  this->inductionVariables = (InductionVariableSet *)0x0;
  this->availableIntBoundChecks = (IntBoundCheckSet *)0x0;
  this->startCallCount = 0;
  this->argOutCount = 0;
  this->totalOutParamCount = 0;
  this->callSequence = (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
  this->stackLiteralInitFldDataMap = (StackLiteralInitFldDataMap *)0x0;
  this->capturedValuesCandidate = (CapturedValues *)0x0;
  this->capturedValues = (CapturedValues *)0x0;
  this->changedSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->hasCSECandidates = false;
  this->hasDataRef = (bool *)0x0;
  this->globOpt = (GlobOpt *)0x0;
  return;
}

Assistant:

GlobOptBlockData(Func *func) :
        symToValueMap(nullptr),
        exprToValueMap(nullptr),
        liveFields(nullptr),
        liveArrayValues(nullptr),
        maybeWrittenTypeSyms(nullptr),
        liveVarSyms(nullptr),
        liveInt32Syms(nullptr),
        liveLossyInt32Syms(nullptr),
        liveFloat64Syms(nullptr),
        argObjSyms(nullptr),
        maybeTempObjectSyms(nullptr),
        canStoreTempObjectSyms(nullptr),
        valuesToKillOnCalls(nullptr),
        inductionVariables(nullptr),
        availableIntBoundChecks(nullptr),
        startCallCount(0),
        argOutCount(0),
        totalOutParamCount(0),
        callSequence(nullptr),
        capturedValuesCandidate(nullptr),
        capturedValues(nullptr),
        changedSyms(nullptr),
        hasCSECandidates(false),
        curFunc(func),
        hasDataRef(nullptr),
        stackLiteralInitFldDataMap(nullptr),
        globOpt(nullptr)
    {
    }